

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int writeJournalHdr(Pager *pPager)

{
  uint amt;
  uint uVar1;
  i64 iVar2;
  Pager *in_RDI;
  int ii;
  u32 nWrite;
  u32 nHeader;
  char *zHeader;
  int rc;
  uint in_stack_ffffffffffffffd8;
  int iVar3;
  uint local_20;
  uchar (*__s) [8];
  undefined4 in_stack_fffffffffffffff0;
  int N;
  
  N = 0;
  __s = (uchar (*) [8])in_RDI->pTmpSpace;
  amt = (uint)in_RDI->pageSize;
  if (in_RDI->sectorSize < amt) {
    amt = in_RDI->sectorSize;
  }
  for (iVar3 = 0; iVar3 < in_RDI->nSavepoint; iVar3 = iVar3 + 1) {
    if (in_RDI->aSavepoint[iVar3].iHdrOffset == 0) {
      in_RDI->aSavepoint[iVar3].iHdrOffset = in_RDI->journalOff;
    }
  }
  iVar2 = journalHdrOffset(in_RDI);
  in_RDI->journalOff = iVar2;
  in_RDI->journalHdr = iVar2;
  if ((in_RDI->noSync == '\0') && (in_RDI->journalMode != '\x04')) {
    uVar1 = sqlite3OsDeviceCharacteristics
                      ((sqlite3_file *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
    if ((uVar1 & 0x200) == 0) {
      memset(__s,0,0xc);
      goto LAB_001612f0;
    }
  }
  *__s = (uchar  [8])0xd763a120f905d5d9;
  sqlite3Put4byte(__s[1],0xffffffff);
LAB_001612f0:
  if (in_RDI->journalMode != '\x04') {
    sqlite3_randomness(N,__s);
  }
  sqlite3Put4byte(__s[1] + 4,in_RDI->cksumInit);
  sqlite3Put4byte(__s[2],in_RDI->dbOrigSize);
  sqlite3Put4byte(__s[2] + 4,in_RDI->sectorSize);
  sqlite3Put4byte(__s[3],(u32)in_RDI->pageSize);
  memset(__s[3] + 4,0,(ulong)amt - 0x1c);
  local_20 = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffd8 & 0xffffff;
    if (N == 0) {
      uVar1 = CONCAT13(local_20 < in_RDI->sectorSize,(int3)in_stack_ffffffffffffffd8);
    }
    in_stack_ffffffffffffffd8 = uVar1;
    if ((char)(in_stack_ffffffffffffffd8 >> 0x18) == '\0') break;
    N = sqlite3OsWrite((sqlite3_file *)CONCAT44(N,in_stack_fffffffffffffff0),__s,amt,
                       CONCAT44(iVar3,in_stack_ffffffffffffffd8));
    in_RDI->journalOff = (ulong)amt + in_RDI->journalOff;
    local_20 = amt + local_20;
  }
  return N;
}

Assistant:

static int writeJournalHdr(Pager *pPager){
  int rc = SQLITE_OK;                 /* Return code */
  char *zHeader = pPager->pTmpSpace;  /* Temporary space used to build header */
  u32 nHeader = (u32)pPager->pageSize;/* Size of buffer pointed to by zHeader */
  u32 nWrite;                         /* Bytes of header sector written */
  int ii;                             /* Loop counter */

  assert( isOpen(pPager->jfd) );      /* Journal file must be open. */

  if( nHeader>JOURNAL_HDR_SZ(pPager) ){
    nHeader = JOURNAL_HDR_SZ(pPager);
  }

  /* If there are active savepoints and any of them were created
  ** since the most recent journal header was written, update the
  ** PagerSavepoint.iHdrOffset fields now.
  */
  for(ii=0; ii<pPager->nSavepoint; ii++){
    if( pPager->aSavepoint[ii].iHdrOffset==0 ){
      pPager->aSavepoint[ii].iHdrOffset = pPager->journalOff;
    }
  }

  pPager->journalHdr = pPager->journalOff = journalHdrOffset(pPager);

  /*
  ** Write the nRec Field - the number of page records that follow this
  ** journal header. Normally, zero is written to this value at this time.
  ** After the records are added to the journal (and the journal synced,
  ** if in full-sync mode), the zero is overwritten with the true number
  ** of records (see syncJournal()).
  **
  ** A faster alternative is to write 0xFFFFFFFF to the nRec field. When
  ** reading the journal this value tells SQLite to assume that the
  ** rest of the journal file contains valid page records. This assumption
  ** is dangerous, as if a failure occurred whilst writing to the journal
  ** file it may contain some garbage data. There are two scenarios
  ** where this risk can be ignored:
  **
  **   * When the pager is in no-sync mode. Corruption can follow a
  **     power failure in this case anyway.
  **
  **   * When the SQLITE_IOCAP_SAFE_APPEND flag is set. This guarantees
  **     that garbage data is never appended to the journal file.
  */
  assert( isOpen(pPager->fd) || pPager->noSync );
  if( pPager->noSync || (pPager->journalMode==PAGER_JOURNALMODE_MEMORY)
   || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_SAFE_APPEND)
  ){
    memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
    put32bits(&zHeader[sizeof(aJournalMagic)], 0xffffffff);
  }else{
    memset(zHeader, 0, sizeof(aJournalMagic)+4);
  }



  /* The random check-hash initializer */
  if( pPager->journalMode!=PAGER_JOURNALMODE_MEMORY ){
    sqlite3_randomness(sizeof(pPager->cksumInit), &pPager->cksumInit);
  }
#ifdef SQLITE_DEBUG
  else{
    /* The Pager.cksumInit variable is usually randomized above to protect
    ** against there being existing records in the journal file. This is
    ** dangerous, as following a crash they may be mistaken for records
    ** written by the current transaction and rolled back into the database
    ** file, causing corruption. The following assert statements verify
    ** that this is not required in "journal_mode=memory" mode, as in that
    ** case the journal file is always 0 bytes in size at this point.
    ** It is advantageous to avoid the sqlite3_randomness() call if possible
    ** as it takes the global PRNG mutex.  */
    i64 sz = 0;
    sqlite3OsFileSize(pPager->jfd, &sz);
    assert( sz==0 );
    assert( pPager->journalOff==journalHdrOffset(pPager) );
    assert( sqlite3JournalIsInMemory(pPager->jfd) );
  }
#endif
  put32bits(&zHeader[sizeof(aJournalMagic)+4], pPager->cksumInit);

  /* The initial database size */
  put32bits(&zHeader[sizeof(aJournalMagic)+8], pPager->dbOrigSize);
  /* The assumed sector size for this process */
  put32bits(&zHeader[sizeof(aJournalMagic)+12], pPager->sectorSize);

  /* The page size */
  put32bits(&zHeader[sizeof(aJournalMagic)+16], pPager->pageSize);

  /* Initializing the tail of the buffer is not necessary.  Everything
  ** works find if the following memset() is omitted.  But initializing
  ** the memory prevents valgrind from complaining, so we are willing to
  ** take the performance hit.
  */
  memset(&zHeader[sizeof(aJournalMagic)+20], 0,
         nHeader-(sizeof(aJournalMagic)+20));

  /* In theory, it is only necessary to write the 28 bytes that the
  ** journal header consumes to the journal file here. Then increment the
  ** Pager.journalOff variable by JOURNAL_HDR_SZ so that the next
  ** record is written to the following sector (leaving a gap in the file
  ** that will be implicitly filled in by the OS).
  **
  ** However it has been discovered that on some systems this pattern can
  ** be significantly slower than contiguously writing data to the file,
  ** even if that means explicitly writing data to the block of
  ** (JOURNAL_HDR_SZ - 28) bytes that will not be used. So that is what
  ** is done.
  **
  ** The loop is required here in case the sector-size is larger than the
  ** database page size. Since the zHeader buffer is only Pager.pageSize
  ** bytes in size, more than one call to sqlite3OsWrite() may be required
  ** to populate the entire journal header sector.
  */
  for(nWrite=0; rc==SQLITE_OK&&nWrite<JOURNAL_HDR_SZ(pPager); nWrite+=nHeader){
    IOTRACE(("JHDR %p %lld %d\n", pPager, pPager->journalHdr, nHeader))
    rc = sqlite3OsWrite(pPager->jfd, zHeader, nHeader, pPager->journalOff);
    assert( pPager->journalHdr <= pPager->journalOff );
    pPager->journalOff += nHeader;
  }

  return rc;
}